

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_cs.h
# Opt level: O0

void __thiscall AccountInfoWrap::AccountInfoWrap(AccountInfoWrap *this,AccountInfo *orig)

{
  char *pcVar1;
  string *psVar2;
  AccountInfo *this_00;
  AccountInfo *orig_local;
  AccountInfoWrap *this_local;
  
  this_00 = &this->m_orig;
  tquant::api::AccountInfo::AccountInfo(this_00,orig);
  pcVar1 = _T(&this_00->account_id,&this_00->account_id);
  this->account_id = pcVar1;
  psVar2 = &(this->m_orig).broker;
  pcVar1 = _T(psVar2,psVar2);
  this->broker = pcVar1;
  psVar2 = &(this->m_orig).account;
  pcVar1 = _T(psVar2,psVar2);
  this->account = pcVar1;
  psVar2 = &(this->m_orig).status;
  pcVar1 = _T(psVar2,psVar2);
  this->status = pcVar1;
  psVar2 = &(this->m_orig).msg;
  pcVar1 = _T(psVar2,psVar2);
  this->msg = pcVar1;
  psVar2 = &(this->m_orig).account_type;
  pcVar1 = _T(psVar2,psVar2);
  this->account_type = pcVar1;
  return;
}

Assistant:

AccountInfoWrap(const AccountInfo& orig) : m_orig(orig)
    {
        account_id   = _T( m_orig.account_id   , m_orig.account_id  );
        broker       = _T( m_orig.broker       , m_orig.broker      );
        account      = _T( m_orig.account      , m_orig.account     );
        status       = _T( m_orig.status       , m_orig.status      );
        msg          = _T( m_orig.msg          , m_orig.msg         );
        account_type = _T( m_orig.account_type , m_orig.account_type);
    }